

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Global_set(w3Interp *this)

{
  w3Tag *pwVar1;
  Value *pVVar2;
  undefined8 extraout_RAX;
  ulong uVar3;
  long unaff_R12;
  w3Stack *unaff_R15;
  
  uVar3 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  if (uVar3 < (ulong)((long)(this->module->globals).
                            super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->module->globals).
                            super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5)) {
    unaff_R15 = &this->super_w3Stack;
    pwVar1 = w3Stack::tag(unaff_R15);
    unaff_R12 = uVar3 * 0x20;
    if (*pwVar1 ==
        (this->module->globals).super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3].global_type.value_type) {
      pVVar2 = w3Stack::value(unaff_R15);
      (this->module_instance->globals).
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3].value.value = *pVVar2;
      w3Stack::pop_value(unaff_R15);
      return;
    }
  }
  else {
    this = (w3Interp *)&stack0xffffffffffffffc0;
    StringFormat_abi_cxx11_((string *)this,"%lX %lX",uVar3);
    AssertFailedFormat("i < module->globals.size ()",(string *)this);
  }
  pwVar1 = w3Stack::tag(unaff_R15);
  StringFormat_abi_cxx11_
            ((string *)&stack0xffffffffffffffc0,"%X %X",(ulong)*pwVar1,
             (ulong)(&(((this->module->globals).super__Vector_base<Global,_std::allocator<Global>_>.
                        _M_impl.super__Vector_impl_data._M_start)->global_type).value_type)
                    [unaff_R12]);
  AssertFailedFormat("tag () == module->globals [i].global_type.value_type",
                     (string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

INTERP (Global_set)
{
    const size_t i = instr->u32;
    AssertFormat (i < module->globals.size (), ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, module->globals.size ()));
    // TODO assert mutable
    AssertFormat (tag () == module->globals [i].global_type.value_type, ("%X %X", tag (), module->globals [i].global_type.value_type));
    module_instance->globals [i].value.value = value ();
    pop_value ();
}